

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O2

InternalApproxTopKState * __thiscall duckdb::ApproxTopKState::GetState(ApproxTopKState *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->state != (InternalApproxTopKState *)0x0) {
    return this->state;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"No state available",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const InternalApproxTopKState &GetState() const {
		if (!state) {
			throw InternalException("No state available");
		}
		return *state;
	}